

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder * __thiscall
capnp::Orphan<capnp::DynamicList>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicList> *this)

{
  uint8_t uVar1;
  undefined2 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  Which elementType;
  SegmentBuilder *pSVar8;
  CapTableBuilder *pCVar9;
  StructPointerCount SVar10;
  undefined1 uVar11;
  ListElementCount LVar12;
  BitsPerElementN<23> BVar13;
  ElementSize EVar14;
  StructSize elementSize;
  ListBuilder *__return_storage_ptr___00;
  Schema in_stack_ffffffffffffff88;
  ListBuilder local_50;
  
  __return_storage_ptr___00 = (ListBuilder *)&stack0xffffffffffffff88;
  uVar1 = (this->schema).elementType.listDepth;
  uVar2 = (this->schema).elementType.baseType;
  uVar4 = (this->schema).elementType.listDepth;
  uVar5 = (this->schema).elementType.isImplicitParam;
  uVar6 = (this->schema).elementType.field_3;
  uVar7 = *(undefined2 *)&(this->schema).elementType.field_0x6;
  aVar3 = (this->schema).elementType.field_4;
  if ((uVar1 == '\0') && ((this->schema).elementType.baseType == STRUCT)) {
    Type::asStruct((Type *)this);
    elementSize = anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffff88.raw)
    ;
    __return_storage_ptr___00 = &local_50;
    _::OrphanBuilder::asStructList(__return_storage_ptr___00,&this->builder,elementSize);
  }
  else {
    elementType = LIST;
    if (uVar1 == '\0') {
      elementType = uVar2;
    }
    EVar14 = anon_unknown_71::elementSizeFor(elementType);
    _::OrphanBuilder::asList((ListBuilder *)&stack0xffffffffffffff88,&this->builder,EVar14);
  }
  SVar10 = __return_storage_ptr___00->structPointerCount;
  EVar14 = __return_storage_ptr___00->elementSize;
  uVar11 = __return_storage_ptr___00->field_0x27;
  (__return_storage_ptr__->builder).structDataSize = __return_storage_ptr___00->structDataSize;
  (__return_storage_ptr__->builder).structPointerCount = SVar10;
  (__return_storage_ptr__->builder).elementSize = EVar14;
  (__return_storage_ptr__->builder).field_0x27 = uVar11;
  pSVar8 = __return_storage_ptr___00->segment;
  pCVar9 = __return_storage_ptr___00->capTable;
  LVar12 = __return_storage_ptr___00->elementCount;
  BVar13 = __return_storage_ptr___00->step;
  (__return_storage_ptr__->builder).ptr = __return_storage_ptr___00->ptr;
  (__return_storage_ptr__->builder).elementCount = LVar12;
  (__return_storage_ptr__->builder).step = BVar13;
  (__return_storage_ptr__->builder).segment = pSVar8;
  (__return_storage_ptr__->builder).capTable = pCVar9;
  (__return_storage_ptr__->schema).elementType.baseType = uVar2;
  (__return_storage_ptr__->schema).elementType.listDepth = uVar4;
  (__return_storage_ptr__->schema).elementType.isImplicitParam = (bool)uVar5;
  (__return_storage_ptr__->schema).elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)uVar6;
  *(undefined2 *)&(__return_storage_ptr__->schema).elementType.field_0x6 = uVar7;
  (__return_storage_ptr__->schema).elementType.field_4 = aVar3;
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Builder Orphan<DynamicList>::get() {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(
        schema, builder.asStructList(structSizeFromSchema(schema.getStructElementType())));
  } else {
    return DynamicList::Builder(
        schema, builder.asList(elementSizeFor(schema.whichElementType())));
  }
}